

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

string * __thiscall cpplog::Logger::toString_abi_cxx11_(Logger *this,time_point timestamp)

{
  pointer __buf;
  char *pcVar1;
  ulong uVar2;
  string *in_RDI;
  array<char,_1024UL> buff;
  time_t time;
  string *text;
  time_point *in_stack_fffffffffffffbc0;
  allocator *paVar3;
  allocator local_422;
  undefined1 local_421;
  undefined1 local_420 [1024];
  time_t local_20 [4];
  
  local_20[0] = std::chrono::_V2::system_clock::to_time_t(in_stack_fffffffffffffbc0);
  memset(local_420,0,0x400);
  local_421 = 0;
  __buf = std::array<char,_1024UL>::data((array<char,_1024UL> *)0x1079c6);
  pcVar1 = ctime_r(local_20,__buf);
  paVar3 = &local_422;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_422);
  uVar2 = std::__cxx11::string::find_last_of((char)in_RDI,10);
  std::__cxx11::string::erase((ulong)in_RDI,uVar2);
  return in_RDI;
}

Assistant:

std::string Logger::toString(std::chrono::system_clock::time_point timestamp) const
{
    auto time = std::chrono::system_clock::to_time_t(timestamp);
#ifdef _POSIX_C_SOURCE
    // ctime is not thread-safe so use thread-safe alternative
    std::array<char, 1024> buff = {0};
    std::string text = ctime_r(&time, buff.data());
#else
    std::string text = ctime(&time);
#endif
    // required, since ctime (asctime) append a new-line
    text.erase(text.find_last_of('\n'), 1);
    return text;
}